

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallSet.h
# Opt level: O0

size_type __thiscall
llvm::SmallSet<unsigned_int,_5U,_std::less<unsigned_int>_>::count
          (SmallSet<unsigned_int,_5U,_std::less<unsigned_int>_> *this,uint *V)

{
  bool bVar1;
  VIterator puVar2;
  const_iterator puVar3;
  uint *V_local;
  SmallSet<unsigned_int,_5U,_std::less<unsigned_int>_> *this_local;
  
  bVar1 = isSmall(this);
  if (bVar1) {
    puVar2 = vfind(this,V);
    puVar3 = SmallVectorTemplateCommon<unsigned_int,_void>::end
                       ((SmallVectorTemplateCommon<unsigned_int,_void> *)this);
    this_local = (SmallSet<unsigned_int,_5U,_std::less<unsigned_int>_> *)
                 (long)(int)(uint)(puVar2 != puVar3);
  }
  else {
    this_local = (SmallSet<unsigned_int,_5U,_std::less<unsigned_int>_> *)
                 std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                 count(&this->Set,V);
  }
  return (size_type)this_local;
}

Assistant:

size_type count(const T &V) const {
    if (isSmall()) {
      // Since the collection is small, just do a linear search.
      return vfind(V) == Vector.end() ? 0 : 1;
    } else {
      return Set.count(V);
    }
  }